

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

char * prediction_type::to_string(prediction_type_t prediction_type)

{
  if (prediction_type < 8) {
    return &DAT_002365a8 + *(int *)(&DAT_002365a8 + (ulong)prediction_type * 4);
  }
  return "<unsupported>";
}

Assistant:

const char* to_string(prediction_type_t prediction_type)
{
  switch (prediction_type)
  {
    CASE(scalar)
    CASE(scalars)
    CASE(action_scores)
    CASE(action_probs)
    CASE(multiclass)
    CASE(multilabels)
    CASE(prob)
    CASE(multiclassprobs)
    default:
      return "<unsupported>";
  }
}